

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::CommissionerApp::OnJoinerRequest_abi_cxx11_
          (string *__return_storage_ptr__,CommissionerApp *this,ByteArray *aJoinerId)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  key_type local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48.mType = kMeshCoP;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48.mId,aJoinerId);
  iVar1 = std::
          _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
          ::find(&(this->mJoiners)._M_t,&local_48);
  if (local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  p_Var2 = &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    local_48.mType = kMeshCoP;
    Commissioner::ComputeJoinerId(&local_48.mId,0);
    iVar1 = std::
            _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::find(&(this->mJoiners)._M_t,&local_48);
    if (local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string CommissionerApp::OnJoinerRequest(const ByteArray &aJoinerId)
{
    std::string pskd;

    auto joinerInfo = mJoiners.find({JoinerType::kMeshCoP, aJoinerId});
    if (joinerInfo != mJoiners.end())
    {
        ExitNow(pskd = joinerInfo->second.mPSKd);
    }

    // Check if all joiners has been enabled.
    joinerInfo = mJoiners.find({JoinerType::kMeshCoP, Commissioner::ComputeJoinerId(0)});
    if (joinerInfo != mJoiners.end())
    {
        ExitNow(pskd = joinerInfo->second.mPSKd);
    }

exit:
    return pskd;
}